

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::SamplesMissMatchTest
          (SamplesMissMatchTest *this,Context *context)

{
  pointer *pptVar1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  iterator __position;
  long lVar5;
  long lVar6;
  testCase test_case;
  testCase local_64;
  vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
  *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"samples_missmatch",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData have different number of samples"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplesMissMatchTest_02109630;
  lVar5 = 0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  local_50 = (vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
              *)&this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    iVar2 = SamplesMissMatchTest::n_samples[lVar5];
    lVar6 = 0;
    local_48 = lVar5;
    do {
      iVar3 = SamplesMissMatchTest::n_samples[lVar6];
      lVar5 = 0;
      local_40 = lVar6;
      do {
        GVar4 = SamplesMissMatchTest::targets[lVar5];
        lVar6 = 0;
        local_38 = lVar5;
        do {
          local_64.m_dst_target = *(GLenum *)((long)SamplesMissMatchTest::targets + lVar6);
          if (iVar2 == iVar3) {
            local_64.m_expected_result = 0;
          }
          else {
            local_64.m_expected_result = 0x502;
          }
          __position._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_64.m_src_target = GVar4;
            local_64.m_src_n_samples = iVar2;
            local_64.m_dst_n_samples = iVar3;
            std::
            vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::SamplesMissMatchTest::testCase_const&>
                      (local_50,__position,&local_64);
          }
          else {
            (__position._M_current)->m_expected_result = local_64.m_expected_result;
            (__position._M_current)->m_src_target = GVar4;
            (__position._M_current)->m_src_n_samples = iVar2;
            (__position._M_current)->m_dst_target = local_64.m_dst_target;
            (__position._M_current)->m_dst_n_samples = iVar3;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          lVar6 = lVar6 + 4;
        } while (lVar6 == 4);
        lVar5 = local_38 + 1;
      } while (local_38 == 0);
      lVar6 = local_40 + 1;
    } while (local_40 == 0);
    lVar5 = local_48 + 1;
  } while (local_48 == 0);
  return;
}

Assistant:

SamplesMissMatchTest::SamplesMissMatchTest(deqp::Context& context)
	: TestCase(context, "samples_missmatch", "Test verifies if INVALID_OPERATION is generated when textures provided "
											 "to CopySubImageData have different number of samples")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	testCase test_case;

	static const GLsizei n_samples[2] = { 1, 4 };

	static const GLenum targets[2] = { GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	for (GLuint src_sample = 0; src_sample < 2; ++src_sample)
	{
		for (GLuint dst_sample = 0; dst_sample < 2; ++dst_sample)
		{
			for (GLuint src_target = 0; src_target < 2; ++src_target)
			{
				for (GLuint dst_target = 0; dst_target < 2; ++dst_target)
				{
					test_case.m_src_target	= targets[src_target];
					test_case.m_src_n_samples = n_samples[src_sample];
					test_case.m_dst_target	= targets[dst_target];
					test_case.m_dst_n_samples = n_samples[dst_sample];

					if (test_case.m_src_n_samples == test_case.m_dst_n_samples)
					{
						test_case.m_expected_result = GL_NO_ERROR;
					}
					else
					{
						test_case.m_expected_result = GL_INVALID_OPERATION;
					}

					m_test_cases.push_back(test_case);
				}
			}
		}
	}
}